

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# locid.cpp
# Opt level: O2

int __thiscall
icu_63::Locale::clone(Locale *this,__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  Locale *this_00;
  
  this_00 = (Locale *)UMemory::operator_new((UMemory *)0xe0,(size_t)__fn);
  if (this_00 != (Locale *)0x0) {
    Locale(this_00,this);
  }
  return (int)this_00;
}

Assistant:

Locale *
Locale::clone() const {
    return new Locale(*this);
}